

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O1

int Abc_SopIsOrType(char *pSop)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  
  lVar2 = 0;
  do {
    if (pSop[lVar2] == '\0') {
      iVar1 = -1;
LAB_001edeca:
      iVar4 = 0;
      iVar3 = 0;
      if ((pSop != (char *)0x0) && (cVar7 = *pSop, cVar7 != '\0')) {
        pcVar5 = pSop + 1;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(cVar7 == '\n');
          cVar7 = *pcVar5;
          pcVar5 = pcVar5 + 1;
        } while (cVar7 != '\0');
      }
      if (iVar1 == iVar3) {
        if (*pSop != '\0') {
          iVar1 = iVar1 + 3;
          pcVar5 = pSop + 1;
          do {
            cVar7 = *pSop;
            if (cVar7 == ' ') {
              return 0;
            }
            iVar4 = 0;
            pcVar6 = pcVar5;
            do {
              iVar4 = iVar4 + (uint)(cVar7 != '-');
              cVar7 = *pcVar6;
              pcVar6 = pcVar6 + 1;
            } while (cVar7 != ' ');
            if (iVar4 != 1) {
              return 0;
            }
            pcVar5 = pcVar5 + iVar1;
            pcVar6 = pSop + iVar1;
            pSop = pSop + iVar1;
          } while (*pcVar6 != '\0');
        }
        iVar4 = 1;
      }
      return iVar4;
    }
    if (pSop[lVar2] == '\n') {
      iVar1 = (int)lVar2 + -2;
      goto LAB_001edeca;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

int Abc_SopIsOrType( char * pSop )
{
    char * pCube, * pCur;
    int nVars, nLits;
    nVars = Abc_SopGetVarNum( pSop );
    if ( nVars != Abc_SopGetCubeNum(pSop) )
        return 0;
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        // count the number of literals in the cube
        nLits = 0;
        for ( pCur = pCube; *pCur != ' '; pCur++ )
            nLits += ( *pCur != '-' );
        if ( nLits != 1 )
            return 0;
    }
    return 1;
}